

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp.h
# Opt level: O3

double __thiscall atan_fm_demodulator::operator()(atan_fm_demodulator *this,complex<double> *s)

{
  undefined8 uVar1;
  double dVar2;
  double local_28;
  ulong local_20;
  
  local_20 = *(ulong *)((this->s1)._M_value + 8) ^ 0x8000000000000000;
  local_28 = *(double *)(this->s1)._M_value;
  std::complex<double>::operator*=((complex<double> *)&local_28,s);
  dVar2 = carg(local_28);
  uVar1 = *(undefined8 *)(s->_M_value + 8);
  *(undefined8 *)(this->s1)._M_value = *(undefined8 *)s->_M_value;
  *(undefined8 *)((this->s1)._M_value + 8) = uVar1;
  return dVar2;
}

Assistant:

double operator()(const std::complex<double>& s)
    {
        double d = std::arg(std::conj(s1) * s);
        s1 = s;
        return d;
    }